

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed_solomn_reconstruct.cpp
# Opt level: O0

vector<__int128,_std::allocator<__int128>_> * __thiscall
reed_solomn::poly_sub
          (reed_solomn *this,vector<__int128,_std::allocator<__int128>_> *A,
          vector<__int128,_std::allocator<__int128>_> *b)

{
  undefined1 b_00 [16];
  undefined1 a [16];
  size_type sVar1;
  size_type sVar2;
  ulong uVar3;
  reference pvVar4;
  reed_solomn *in_RCX;
  vector<__int128,_std::allocator<__int128>_> *in_RDX;
  undefined8 extraout_RDX;
  reed_solomn *in_RDI;
  int i;
  vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  tmp;
  vector<__int128,_std::allocator<__int128>_> res;
  value_type *__x;
  vector<__int128,_std::allocator<__int128>_> *this_00;
  undefined8 in_stack_fffffffffffffec8;
  vector<__int128,_std::allocator<__int128>_> *in_stack_fffffffffffffed0;
  reed_solomn *this_01;
  vector<__int128,_std::allocator<__int128>_> *in_stack_ffffffffffffff10;
  vector<__int128,_std::allocator<__int128>_> *in_stack_ffffffffffffff28;
  vector<__int128,_std::allocator<__int128>_> *in_stack_ffffffffffffff30;
  reed_solomn *in_stack_ffffffffffffff38;
  vector<__int128,_std::allocator<__int128>_> *in_stack_ffffffffffffff58;
  vector<__int128,_std::allocator<__int128>_> *in_stack_ffffffffffffff60;
  int local_94;
  vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  local_50 [3];
  
  this_01 = in_RDI;
  std::vector<__int128,_std::allocator<__int128>_>::vector
            ((vector<__int128,_std::allocator<__int128>_> *)0x13b018);
  std::vector<__int128,_std::allocator<__int128>_>::vector(in_stack_ffffffffffffff10,in_RDX);
  std::vector<__int128,_std::allocator<__int128>_>::vector(in_stack_ffffffffffffff10,in_RDX);
  poly_align(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::vector<__int128,_std::allocator<__int128>_>::~vector(in_stack_fffffffffffffed0);
  std::vector<__int128,_std::allocator<__int128>_>::~vector(in_stack_fffffffffffffed0);
  std::
  vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  ::operator[](local_50,0);
  std::vector<__int128,_std::allocator<__int128>_>::operator=
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::
  vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  ::operator[](local_50,1);
  std::vector<__int128,_std::allocator<__int128>_>::operator=
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  sVar1 = std::vector<__int128,_std::allocator<__int128>_>::size(in_RDX);
  sVar2 = std::vector<__int128,_std::allocator<__int128>_>::size
                    ((vector<__int128,_std::allocator<__int128>_> *)in_RCX);
  if (sVar1 == sVar2) {
    local_94 = 0;
    while( true ) {
      uVar3 = (ulong)local_94;
      sVar1 = std::vector<__int128,_std::allocator<__int128>_>::size(in_RDX);
      if (sVar1 <= uVar3) break;
      pvVar4 = std::vector<__int128,_std::allocator<__int128>_>::operator[](in_RDX,(long)local_94);
      this_00 = *(vector<__int128,_std::allocator<__int128>_> **)pvVar4;
      __x = *(value_type **)((long)pvVar4 + 8);
      std::vector<__int128,_std::allocator<__int128>_>::operator[]
                ((vector<__int128,_std::allocator<__int128>_> *)in_RCX,(long)local_94);
      a._8_8_ = uVar3;
      a._0_8_ = in_stack_fffffffffffffed0;
      b_00._8_8_ = in_stack_fffffffffffffec8;
      b_00._0_8_ = this_00;
      in_stack_fffffffffffffed0 =
           (vector<__int128,_std::allocator<__int128>_> *)base_sub(in_RCX,(ll128)a,(ll128)b_00);
      in_stack_fffffffffffffec8 = extraout_RDX;
      std::vector<__int128,_std::allocator<__int128>_>::push_back(this_00,__x);
      local_94 = local_94 + 1;
    }
    std::vector<__int128,_std::allocator<__int128>_>::vector(in_stack_ffffffffffffff10,in_RDX);
    poly_strip(this_01,(vector<__int128,_std::allocator<__int128>_> *)in_RDI);
    std::vector<__int128,_std::allocator<__int128>_>::~vector(in_stack_fffffffffffffed0);
    std::
    vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
    ::~vector((vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
               *)in_stack_fffffffffffffed0);
    std::vector<__int128,_std::allocator<__int128>_>::~vector(in_stack_fffffffffffffed0);
    return (vector<__int128,_std::allocator<__int128>_> *)this_01;
  }
  __assert_fail("A.size() == b.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SMMLF[P]MPL-Public/malicious_lib/reed_solomn_reconstruct.cpp"
                ,0x96,"vector<ll128> reed_solomn::poly_sub(vector<ll128>, vector<ll128>)");
}

Assistant:

vector<ll128> reed_solomn::poly_sub(vector<ll128> A, vector<ll128> b) {
    vector<ll128> res;
    vector<vector<ll128>> tmp = poly_align(A, b);
    A = tmp[0];
    b = tmp[1];
    assert(A.size() == b.size());
    for (int i = 0; i < A.size(); ++i) {
        res.push_back(base_sub(A[i], b[i]));
    }
    return poly_strip(res);
}